

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O1

void __thiscall mxx::env::~env(env *this)

{
  ~env(this);
  operator_delete(this,8);
  return;
}

Assistant:

virtual ~env() {
        if (env::initialized() && !env::finalized()) {
            MPI_Finalize();
        }
    }